

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::
findImpl<QFontDatabasePrivate::ExtendedScript>
          (QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *this,ExtendedScript *key)

{
  ulong uVar1;
  Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_> *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  Bucket BVar5;
  iterator iVar6;
  
  pDVar2 = this->d;
  if ((pDVar2 == (Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_> *
                 )0x0) || (pDVar2->size == 0)) {
    pDVar3 = (Data *)0x0;
    pDVar4 = (Data *)0x0;
  }
  else {
    uVar1 = (pDVar2->seed >> 0x20 ^ (ulong)*key ^ pDVar2->seed) * -0x2917014799a6026d;
    uVar1 = (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d;
    BVar5 = QHashPrivate::
            Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::
            findBucketWithHash<QFontDatabasePrivate::ExtendedScript>
                      (pDVar2,key,uVar1 >> 0x20 ^ uVar1);
    pDVar2 = this->d;
    pDVar4 = (Data *)(((ulong)((long)BVar5.span - (long)pDVar2->spans) >> 4) * 0x1c71c71c71c71c80 |
                     BVar5.index);
    if ((pDVar2 == (Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>
                    *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::
               Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::
               detached(pDVar2);
      this->d = pDVar2;
    }
    pDVar3 = this->d;
    if (this->d->spans[(ulong)pDVar4 >> 7].offsets[(uint)BVar5.index & 0x7f] == 0xff) {
      pDVar3 = (Data *)0x0;
      pDVar4 = (Data *)0x0;
    }
  }
  iVar6.i.bucket = (size_t)pDVar4;
  iVar6.i.d = pDVar3;
  return (iterator)iVar6.i;
}

Assistant:

iterator findImpl(const K &key)
    {
        if (isEmpty()) // prevents detaching shared null
            return end();
        auto it = d->findBucket(key);
        size_t bucket = it.toBucketIndex(d);
        detach();
        it = typename Data::Bucket(d, bucket); // reattach in case of detach
        if (it.isUnused())
            return end();
        return iterator(it.toIterator(d));
    }